

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O0

string * __thiscall
ws::Crypto::verify_url
          (string *__return_storage_ptr__,Crypto *this,string *msg_sign,string *time_stamp,
          string *nonce,string *echo_str)

{
  int iVar1;
  MsgCryptoError *this_00;
  string *inlen;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *echo_str_local;
  string *nonce_local;
  string *time_stamp_local;
  string *msg_sign_local;
  Crypto *this_local;
  
  inlen = echo_str;
  local_38 = echo_str;
  echo_str_local = nonce;
  nonce_local = time_stamp;
  time_stamp_local = msg_sign;
  msg_sign_local = &this->token;
  this_local = (Crypto *)__return_storage_ptr__;
  iVar1 = verify_sign(this,msg_sign,time_stamp,nonce,echo_str);
  if (iVar1 != 0) {
    this_00 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"verify sign failed.",&local_59);
    MsgCryptoError::MsgCryptoError(this_00,&local_58,(source_location)0x277578);
    __cxa_throw(this_00,&MsgCryptoError::typeinfo,MsgCryptoError::~MsgCryptoError);
  }
  decrypt((Crypto *)__return_storage_ptr__,(EVP_PKEY_CTX *)this,(uchar *)local_38,(size_t *)nonce,
          (uchar *)echo_str,(size_t)inlen);
  return __return_storage_ptr__;
}

Assistant:

std::string verify_url(const std::string &msg_sign, const std::string &time_stamp,
                           const std::string &nonce, const std::string &echo_str)
    {
      if (verify_sign(msg_sign, time_stamp, nonce, echo_str) != 0)
      {
        throw MsgCryptoError("verify sign failed.");
      }
      return decrypt(echo_str);
    }